

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_dpll_triad_simd.cc
# Opt level: O0

void anon_unknown.dwarf_11362::SolverDpllTriadSimd<2>::ExtractSolution(State *state,char *solution)

{
  int minirow_base;
  long in_RDI;
  int box_base;
  FourBy64 box_minirows;
  Box *box;
  int box_idx;
  uint64_t in_stack_ffffffffffffffc0;
  int local_14;
  
  for (local_14 = 0; local_14 < 9; local_14 = local_14 + 1) {
    Bitvec16x16::As_4x64
              ((FourBy64 *)&stack0xffffffffffffffc0,
               (Bitvec16x16 *)(in_RDI + 0xc0 + (long)local_14 * 0x20));
    minirow_base = *(int *)((anonymous_namespace)::tables + (long)local_14 * 4 + 0x18b8) * 0x1b +
                   *(int *)((anonymous_namespace)::tables + (long)local_14 * 4 + 0x18dc) * 3;
    ExtractMiniRow(in_stack_ffffffffffffffc0,minirow_base,(char *)0x11900d);
    ExtractMiniRow(in_stack_ffffffffffffffc0,minirow_base,(char *)0x119023);
    ExtractMiniRow(in_stack_ffffffffffffffc0,minirow_base,(char *)0x119039);
  }
  return;
}

Assistant:

static void ExtractSolution(const State &state, char *solution) {
        for (int box_idx = 0; box_idx < 9; box_idx++) {
            const Box &box = state.boxen[box_idx];
            auto box_minirows = box.cells.As_4x64();
            int box_base = tables.div3[box_idx] * 27 + tables.mod3[box_idx] * 3;
            ExtractMiniRow(box_minirows.x0, box_base, solution);
            ExtractMiniRow(box_minirows.x1, box_base + 9, solution);
            ExtractMiniRow(box_minirows.x2, box_base + 18, solution);
        }
    }